

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void __thiscall phosg::cannot_open_file::cannot_open_file(cannot_open_file *this,int fd)

{
  uint *puVar1;
  int *piVar2;
  int error;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  cannot_open_file *pcStack_10;
  int fd_local;
  cannot_open_file *this_local;
  
  local_14 = fd;
  pcStack_10 = this;
  ::std::__cxx11::to_string(&local_98,fd);
  ::std::operator+(&local_78,"can\'t open fd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  ::std::operator+(&local_58,&local_78,": ");
  puVar1 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_c8,(phosg *)(ulong)*puVar1,error);
  ::std::operator+(&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  this->_vptr_cannot_open_file = (_func_int **)0x151ac8;
  *(undefined8 *)&this->field_0x10 = 0x151af8;
  piVar2 = __errno_location();
  this->error = *piVar2;
  return;
}

Assistant:

cannot_open_file::cannot_open_file(int fd)
    : runtime_error("can\'t open fd " + to_string(fd) + ": " + string_for_error(errno)),
      error(errno) {}